

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

void re2::AppendLiteral(string *t,Rune r,bool foldcase)

{
  char *pcVar1;
  undefined1 in_DL;
  int in_ESI;
  ulong in_RDI;
  Rune in_stack_ffffffffffffffe8;
  Rune in_stack_ffffffffffffffec;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  if (((in_ESI == 0) || (0x7f < in_ESI)) ||
     (pcVar1 = strchr("(){}[]*+?|.^$\\",in_ESI), pcVar1 == (char *)0x0)) {
    if ((((uVar2 & 0x1000000) == 0) || (in_ESI < 0x61)) || (0x7a < in_ESI)) {
      AppendCCRange((string *)CONCAT44(in_ESI,uVar2),in_stack_ffffffffffffffec,
                    in_stack_ffffffffffffffe8);
    }
    else {
      std::__cxx11::string::append(in_RDI,'\x01');
      std::__cxx11::string::append(in_RDI,'\x01');
      std::__cxx11::string::append(in_RDI,'\x01');
      std::__cxx11::string::append(in_RDI,'\x01');
    }
  }
  else {
    std::__cxx11::string::append(in_RDI,'\x01');
    std::__cxx11::string::append(in_RDI,'\x01');
  }
  return;
}

Assistant:

static void AppendLiteral(std::string *t, Rune r, bool foldcase) {
  if (r != 0 && r < 0x80 && strchr("(){}[]*+?|.^$\\", r)) {
    t->append(1, '\\');
    t->append(1, static_cast<char>(r));
  } else if (foldcase && 'a' <= r && r <= 'z') {
    r -= 'a' - 'A';
    t->append(1, '[');
    t->append(1, static_cast<char>(r));
    t->append(1, static_cast<char>(r) + 'a' - 'A');
    t->append(1, ']');
  } else {
    AppendCCRange(t, r, r);
  }
}